

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

BVSparse<Memory::JitArenaAllocator> * __thiscall
BackwardPass::GetByteCodeRegisterUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,JitArenaAllocator *alloc)

{
  Type TVar1;
  RegSlot i;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  StackSym *this_01;
  Func *pFVar3;
  StackSym *stackSym;
  ulong uVar4;
  ulong uVar5;
  
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = alloc;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  pBVar2 = block->byteCodeUpwardExposedUsed;
  while (pBVar2 = (BVSparse<Memory::JitArenaAllocator> *)pBVar2->head,
        pBVar2 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    uVar4 = ((Type *)&pBVar2->alloc)->word;
    if (uVar4 != 0) {
      TVar1 = *(Type *)&pBVar2->lastFoundIndex;
      uVar5 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar5);
        this_01 = (StackSym *)SymTable::Find(func->m_symTable,(BVIndex)uVar5 + TVar1);
        if ((((this_01 != (StackSym *)0x0) && ((this_01->super_Sym).m_kind == SymKindStack)) &&
            (pFVar3 = StackSym::GetByteCodeFunc(this_01), pFVar3 == func)) &&
           ((this_01->field_0x19 & 0x20) != 0)) {
          i = StackSym::GetByteCodeRegSlot(this_01);
          BVSparse<Memory::JitArenaAllocator>::Set(this_00,i);
        }
        uVar4 = uVar4 & ~(1L << (uVar5 & 0x3f));
        uVar5 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
      } while (uVar4 != 0);
    }
  }
  return this_00;
}

Assistant:

BVSparse<JitArenaAllocator>*
BackwardPass::GetByteCodeRegisterUpwardExposed(BasicBlock* block, Func* func, JitArenaAllocator* alloc)
{
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    // Convert the sym to the corresponding bytecode register
    FOREACH_BITSET_IN_SPARSEBV(symID, block->byteCodeUpwardExposedUsed)
    {
        Sym* sym = func->m_symTable->Find(symID);
        if (sym && sym->IsStackSym())
        {
            StackSym* stackSym = sym->AsStackSym();
            // Make sure we only look at bytecode from the func we're interested in
            if (stackSym->GetByteCodeFunc() == func && stackSym->HasByteCodeRegSlot())
            {
                Js::RegSlot bytecode = stackSym->GetByteCodeRegSlot();
                byteCodeRegisterUpwardExposed->Set(bytecode);
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    return byteCodeRegisterUpwardExposed;
}